

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

void __thiscall
capnp::_::ListBuilder::setDataElement<bool>(ListBuilder *this,ElementCount index,bool value)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint bitnum;
  byte *b;
  uint bindex;
  bool value_local;
  ElementCount index_local;
  ListBuilder *this_local;
  
  pbVar2 = this->ptr;
  bVar1 = pbVar2[index >> 3];
  uVar3 = unbound<unsigned_int>(index & 7);
  uVar4 = unbound<unsigned_int>(index & 7);
  pbVar2[index >> 3] =
       bVar1 & ((byte)(1 << ((byte)uVar3 & 0x1f)) ^ 0xff) | value << ((byte)uVar4 & 0x1f);
  return;
}

Assistant:

inline void ListBuilder::setDataElement<bool>(ElementCount index, bool value) {
  // Ignore stepBytes for bit lists because bit lists cannot be upgraded to struct lists.
  auto bindex = index * (ONE * BITS / ELEMENTS);
  byte* b = ptr + bindex / BITS_PER_BYTE;
  auto bitnum = bindex % BITS_PER_BYTE / BITS;
  *reinterpret_cast<uint8_t*>(b) = (*reinterpret_cast<uint8_t*>(b) & ~(1 << unbound(bitnum)))
                                 | (static_cast<uint8_t>(value) << unbound(bitnum));
}